

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O3

void nn_binproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_sinproc *self_00;
  nn_list_item *it;
  int extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  nn_fsm *self_01;
  
  if (*(int *)&self[1].fn == 2) {
    if (src == 1) {
      return;
    }
    if (src != 0x6c41) goto LAB_00128bfb;
    iVar1 = 0x6c41;
    if (type == 1) {
      self_00 = (nn_sinproc *)nn_alloc_(0x290);
      if (self_00 != (nn_sinproc *)0x0) {
        nn_sinproc_init(self_00,1,(nn_epbase *)&self[1].shutdown_fn,self);
        it = nn_list_end((nn_list *)&self[1].stopped);
        nn_list_insert((nn_list *)&self[1].stopped,&self_00->item,it);
        nn_sinproc_accept(self_00,(nn_sinproc *)srcptr);
        return;
      }
      nn_binproc_handler_cold_2();
      goto LAB_00128be6;
    }
  }
  else {
    if (*(int *)&self[1].fn == 1) {
      if (src != -2) goto LAB_00128beb;
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
    }
    else {
LAB_00128be6:
      nn_binproc_handler_cold_6();
LAB_00128beb:
      nn_binproc_handler_cold_4();
    }
    nn_binproc_handler_cold_5();
    type = extraout_EDX;
LAB_00128bfb:
    iVar1 = type;
    nn_binproc_handler_cold_3();
    type = extraout_EDX_00;
  }
  self_01 = (nn_fsm *)(ulong)(uint)type;
  nn_binproc_handler_cold_1();
  if (extraout_EDX_01 != -3 || iVar1 != -2) {
    if (*(int *)&self_01[1].fn == 3) {
      nn_binproc_shutdown_cold_2();
      goto LAB_00128c40;
    }
    nn_binproc_shutdown_cold_1();
  }
  nn_binproc_shutdown_cold_3();
LAB_00128c40:
  iVar1 = nn_list_empty((nn_list *)&self_01[1].stopped);
  if (iVar1 == 0) {
    return;
  }
  *(undefined4 *)&self_01[1].fn = 1;
  nn_fsm_stopped_noevent(self_01);
  nn_epbase_stopped((nn_epbase *)&self_01[1].shutdown_fn);
  return;
}

Assistant:

static void nn_binproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_binproc *binproc;
    struct nn_sinproc *peer;
    struct nn_sinproc *sinproc;

    binproc = nn_cont (self, struct nn_binproc, fsm);

    switch (binproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                binproc->state = NN_BINPROC_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (binproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (binproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_BINPROC_STATE_ACTIVE:
        switch (src) {

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_CONNECT:
                peer = (struct nn_sinproc*) srcptr;
                sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
                alloc_assert (sinproc);
                nn_sinproc_init (sinproc, NN_BINPROC_SRC_SINPROC,
                    &binproc->item.epbase, &binproc->fsm);
                nn_list_insert (&binproc->sinprocs, &sinproc->item,
                    nn_list_end (&binproc->sinprocs));
                nn_sinproc_accept (sinproc, peer);
                return;
            default:
                nn_fsm_bad_action (binproc->state, src, type);
            }

        case NN_BINPROC_SRC_SINPROC:
            return;

        default:
            nn_fsm_bad_source (binproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (binproc->state, src, type);
    }
}